

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O0

void Gia_ManSatokoDimacs(char *pFileName,satoko_opts_t *opts)

{
  abctime aVar1;
  satoko_t *s;
  abctime aVar2;
  satoko_t *pSat;
  int status;
  abctime clk;
  satoko_opts_t *opts_local;
  char *pFileName_local;
  
  aVar1 = Abc_Clock();
  pSat._4_4_ = -1;
  s = Gia_ManSatokoFromDimacs(pFileName,opts);
  if (s != (satoko_t *)0x0) {
    pSat._4_4_ = satoko_solve(s);
    satoko_destroy(s);
  }
  aVar2 = Abc_Clock();
  Gia_ManSatokoReport(-1,pSat._4_4_,aVar2 - aVar1);
  return;
}

Assistant:

void Gia_ManSatokoDimacs( char * pFileName, satoko_opts_t * opts )
{
    abctime clk = Abc_Clock();  
    int status = SATOKO_UNSAT;
    satoko_t * pSat = Gia_ManSatokoFromDimacs( pFileName, opts );
    if ( pSat )
    {
        status = satoko_solve( pSat );
        satoko_destroy( pSat );
    }
    Gia_ManSatokoReport( -1, status, Abc_Clock() - clk );
}